

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

openmode __thiscall
cppforth::Forth::GetFileAccessMode(Forth *this,Cell handler,string *function,errorCodes ec)

{
  pointer pFVar1;
  char cVar2;
  pointer __return_storage_ptr__;
  string local_50 [32];
  
  pFVar1 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__return_storage_ptr__ =
            (this->OpenFiles).
            super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
            ._M_impl.super__Vector_impl_data._M_start; __return_storage_ptr__ != pFVar1;
      __return_storage_ptr__ = __return_storage_ptr__ + 1) {
    if ((*(Cell *)&((_Alloc_hider *)&__return_storage_ptr__->FILE)->_M_p == handler) &&
       (cVar2 = std::__basic_file<char>::is_open(), cVar2 != '\0')) goto LAB_0011e5e9;
  }
  __return_storage_ptr__ = (pointer)local_50;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,function,": wrong file handler access");
  throwMessage(this,(string *)__return_storage_ptr__,ec);
  std::__cxx11::string::~string(local_50);
  __cxa_rethrow();
LAB_0011e5e9:
  return __return_storage_ptr__->fileAccessMode;
}

Assistant:

std::ios_base::openmode GetFileAccessMode(Cell handler, const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler && (*it).fileObject->is_open()) {
			return (*it).fileAccessMode;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}